

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# musashi_softfloat.c
# Opt level: O1

float128 floatx80_to_float128(floatx80 a)

{
  ulong uVar1;
  bits64 aSig;
  ulong uVar2;
  uint uVar3;
  float128 fVar4;
  
  uVar2 = a.low;
  uVar3 = a._0_4_ & 0x7fff;
  uVar1 = (a._0_8_ & 0xffff) >> 0xf;
  if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
      uVar3 != 0x7fff) {
    uVar1 = (ulong)uVar3 << 0x30 | uVar1 << 0x3f | uVar2 >> 0xf & 0xffffffffffff;
  }
  else {
    if ((((undefined1  [16])a & (undefined1  [16])0x3fffffffffffffff) != (undefined1  [16])0x0) &&
       (((undefined1  [16])a & (undefined1  [16])0x4000000000000000) == (undefined1  [16])0x0)) {
      float_exception_flags = float_exception_flags | 1;
    }
    uVar1 = uVar1 << 0x3f | uVar2 >> 0xf | 0x7fff800000000000;
  }
  fVar4.low = uVar2 << 0x31;
  fVar4.high = uVar1;
  return fVar4;
}

Assistant:

float128 floatx80_to_float128( floatx80 a )
{
	flag aSign;
	int16 aExp;
	bits64 aSig, zSig0, zSig1;

	aSig = extractFloatx80Frac( a );
	aExp = extractFloatx80Exp( a );
	aSign = extractFloatx80Sign( a );
	if ( ( aExp == 0x7FFF ) && (bits64) ( aSig<<1 ) ) {
		return commonNaNToFloat128( floatx80ToCommonNaN( a ) );
	}
	shift128Right( aSig<<1, 0, 16, &zSig0, &zSig1 );
	return packFloat128( aSign, aExp, zSig0, zSig1 );

}